

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_11cad6::ClearLoadStoreInfoGlobal(VmModule *module)

{
  SmallArray<VmModule::LoadStoreInfo,_32U> *this;
  VariableData *pVVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  LoadStoreInfo *pLVar5;
  LoadStoreInfo *pLVar6;
  byte bVar7;
  long lVar8;
  uint i;
  uint index;
  byte bVar9;
  
  bVar9 = 0;
  this = &module->loadStoreInfo;
  index = 0;
  do {
    while( true ) {
      if ((module->loadStoreInfo).count <= index) {
        return;
      }
      pLVar5 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](this,index);
      if ((pLVar5->loadAddress == (VmConstant *)0x0) ||
         (pVVar1 = pLVar5->loadAddress->container, pVVar1 == (VariableData *)0x0)) {
        bVar2 = false;
      }
      else {
        bVar2 = IsGlobalScope(pVVar1->scope);
      }
      if ((pLVar5->storeAddress == (VmConstant *)0x0) ||
         (pVVar1 = pLVar5->storeAddress->container, pVVar1 == (VariableData *)0x0)) {
        bVar3 = false;
      }
      else {
        bVar3 = IsGlobalScope(pVVar1->scope);
      }
      if (bVar2 == false) {
        bVar7 = 0;
      }
      else {
        bVar7 = 1;
        if (pLVar5->noLoadOrNoContainerAlias == true) {
          bVar7 = pLVar5->loadAddress->container->isAlloca ^ 1;
        }
      }
      if (bVar3 == false) break;
      if (pLVar5->noStoreOrNoContainerAlias == true) {
        bVar4 = pLVar5->storeAddress->container->isAlloca ^ 1;
        goto LAB_001a31d2;
      }
LAB_001a31d9:
      pLVar5 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(this);
      pLVar6 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](this,index);
      for (lVar8 = 0x52; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(undefined1 *)&pLVar6->loadInst = *(undefined1 *)&pLVar5->loadInst;
        pLVar5 = (LoadStoreInfo *)((long)pLVar5 + (ulong)bVar9 * -2 + 1);
        pLVar6 = (LoadStoreInfo *)((long)pLVar6 + (ulong)bVar9 * -2 + 1);
      }
      SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(this);
    }
    bVar4 = 0;
LAB_001a31d2:
    if ((bVar7 | bVar4) == 1) goto LAB_001a31d9;
    index = index + 1;
  } while( true );
}

Assistant:

void ClearLoadStoreInfoGlobal(VmModule *module)
	{
		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			bool hasLoadFromGlobal = el.loadAddress && el.loadAddress->container && IsGlobalScope(el.loadAddress->container->scope);
			bool hasStoreToGlobal = el.storeAddress && el.storeAddress->container && IsGlobalScope(el.storeAddress->container->scope);

			// If this is an alloca temporary and it cannot be aliased, we can remove it even in the global scope
			if(hasLoadFromGlobal && el.noLoadOrNoContainerAlias && el.loadAddress->container->isAlloca)
				hasLoadFromGlobal = false;

			if(hasStoreToGlobal && el.noStoreOrNoContainerAlias && el.storeAddress->container->isAlloca)
				hasStoreToGlobal = false;

			if(hasLoadFromGlobal || hasStoreToGlobal)
			{
				module->loadStoreInfo[i] = module->loadStoreInfo.back();
				module->loadStoreInfo.pop_back();
			}
			else
			{
				i++;
				continue;
			}
		}
	}